

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O0

void sgai_shift_diagonal_block
               (Integer g_a,void *ptr,Integer *loA,Integer *hiA,Integer ld,void *c,Integer type)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long *in_RCX;
  long *in_RDX;
  long in_RSI;
  long in_R8;
  double *in_R9;
  undefined8 in_stack_00000008;
  SingleComplex *fca;
  DoubleComplex *dca;
  long *la;
  double *da;
  float *fa;
  int *ia;
  Integer i;
  Integer hi [2];
  Integer lo [2];
  Integer jhiA;
  Integer jloA;
  Integer ihiA;
  Integer iloA;
  long local_c0;
  float *local_b0;
  double *local_a8;
  long *local_a0;
  double *local_98;
  float *local_90;
  int *local_88;
  long local_80;
  
  lVar1 = *in_RDX;
  lVar2 = in_RDX[1];
  lVar3 = in_RCX[1];
  if (0 < lVar1) {
    local_c0 = lVar2;
    if (lVar2 <= lVar1) {
      local_c0 = lVar1;
    }
    if (*in_RCX <= lVar3) {
      lVar3 = *in_RCX;
    }
    if (local_c0 <= lVar3) {
      switch(in_stack_00000008) {
      case 0x3e9:
        local_88 = (int *)(((in_R8 * (local_c0 - lVar2) + local_c0) - lVar1) * 4 + in_RSI);
        for (local_80 = 0; local_80 < (lVar3 - local_c0) + 1; local_80 = local_80 + 1) {
          *local_88 = (int)*(float *)in_R9 + *local_88;
          local_88 = local_88 + in_R8 + 1;
        }
        break;
      case 0x3ea:
        local_a0 = (long *)(((in_R8 * (local_c0 - lVar2) + local_c0) - lVar1) * 8 + in_RSI);
        for (local_80 = 0; local_80 < (lVar3 - local_c0) + 1; local_80 = local_80 + 1) {
          *local_a0 = (long)*in_R9 + *local_a0;
          local_a0 = local_a0 + in_R8 + 1;
        }
        break;
      case 0x3eb:
        local_90 = (float *)(((in_R8 * (local_c0 - lVar2) + local_c0) - lVar1) * 4 + in_RSI);
        for (local_80 = 0; local_80 < (lVar3 - local_c0) + 1; local_80 = local_80 + 1) {
          *local_90 = *(float *)in_R9 + *local_90;
          local_90 = local_90 + in_R8 + 1;
        }
        break;
      case 0x3ec:
        local_98 = (double *)(((in_R8 * (local_c0 - lVar2) + local_c0) - lVar1) * 8 + in_RSI);
        for (local_80 = 0; local_80 < (lVar3 - local_c0) + 1; local_80 = local_80 + 1) {
          *local_98 = *in_R9 + *local_98;
          local_98 = local_98 + in_R8 + 1;
        }
        break;
      default:
        pnga_error((char *)g_a,(Integer)ptr);
        break;
      case 0x3ee:
        local_b0 = (float *)(((in_R8 * (local_c0 - lVar2) + local_c0) - lVar1) * 8 + in_RSI);
        for (local_80 = 0; local_80 < (lVar3 - local_c0) + 1; local_80 = local_80 + 1) {
          *local_b0 = *(float *)in_R9 + *local_b0;
          local_b0[1] = *(float *)((long)in_R9 + 4) + local_b0[1];
          local_b0 = local_b0 + (in_R8 + 1) * 2;
        }
        break;
      case 0x3ef:
        local_a8 = (double *)(((in_R8 * (local_c0 - lVar2) + local_c0) - lVar1) * 0x10 + in_RSI);
        for (local_80 = 0; local_80 < (lVar3 - local_c0) + 1; local_80 = local_80 + 1) {
          *local_a8 = *in_R9 + *local_a8;
          local_a8[1] = in_R9[1] + local_a8[1];
          local_a8 = local_a8 + (in_R8 + 1) * 2;
        }
      }
    }
  }
  return;
}

Assistant:

static void sgai_shift_diagonal_block(Integer g_a, void *ptr, Integer *loA, Integer *hiA,
                              Integer ld, void *c, Integer type)
{
  Integer iloA, ihiA, jloA, jhiA, lo[2], hi[2];
  Integer i;
  int *ia;
  float *fa;
  double *da;
  long *la;
  DoubleComplex *dca;
  SingleComplex *fca;

  iloA = loA[0];
  ihiA = hiA[0];
  jloA = loA[1];
  jhiA = hiA[1];

  /* determine subset of my patch to access */
  if (iloA > 0)
  {
    lo[0] = GA_MAX (iloA, jloA);
    lo[1] = GA_MAX (iloA, jloA);
    hi[0] = GA_MIN (ihiA, jhiA);
    hi[1] = GA_MIN (ihiA, jhiA);
    if (hi[0] >= lo[0]) /*make sure the equality sign is there since it is the singleton case */
    {                   /* we got a block containing diagonal elements */

      switch (type)
      {
        case C_INT:
          ia = (int *) ptr;
          ia += ld*(lo[1]-jloA) + lo[0]-iloA;
          for (i = 0; i < hi[0] - lo[0] + 1; i++)
          {
            *ia += *((int *) c);
            ia += ld + 1;
          }
          break;
        case C_LONG:
          la = (long *) ptr;
          la += ld*(lo[1]-jloA) + lo[0]-iloA;
          for (i = 0; i < hi[0] - lo[0] + 1; i++)
          {
            *la += *((long *) c);
            la += ld + 1;
          }
          break;
        case C_FLOAT:
          fa = (float *) ptr;
          fa += ld*(lo[1]-jloA) + lo[0]-iloA;
          for (i = 0; i < hi[0] - lo[0] + 1; i++)
          {
            *fa += *((float *) c);
            fa += ld + 1;
          }
          break;
        case C_DBL:
          da = (double *) ptr;
          da += ld*(lo[1]-jloA) + lo[0]-iloA;
          for (i = 0; i < hi[0] - lo[0] + 1; i++)
          {
            *da += *((double *) c);
            da += ld + 1;
          }
          break;
        case C_DCPL:
          dca = (DoubleComplex *) ptr;
          dca += ld*(lo[1]-jloA) + lo[0]-iloA;
          for (i = 0; i < hi[0] - lo[0] + 1; i++)
          {
            (*dca).real += (*((DoubleComplex *) c)).real;
            (*dca).imag += (*((DoubleComplex *) c)).imag;
            dca += ld + 1;
          }
          break;

        case C_SCPL:
          fca = (SingleComplex *) ptr;
          fca += ld*(lo[1]-jloA) + lo[0]-iloA;
          for (i = 0; i < hi[0] - lo[0] + 1; i++)
          {
            (*fca).real += (*((SingleComplex *) c)).real;
            (*fca).imag += (*((SingleComplex *) c)).imag;
            fca += ld + 1;
          }
          break;

        default:
          pnga_error("ga_shift_diagonal_: wrong data type:", type);
      }
    }
  }
}